

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

double __thiscall doctest::detail::ResultBuilder::log(ResultBuilder *this,double __x)

{
  String *rhs;
  Enum EVar1;
  undefined8 *puVar2;
  byte bVar3;
  bool bVar4;
  uint uVar5;
  IReporter **curr_rep;
  undefined8 *puVar6;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  String SStack_78;
  String local_60;
  String local_48;
  String local_30;
  
  EVar1 = (this->super_AssertData).m_at;
  if ((EVar1 & is_throws) == 0) {
    if ((~EVar1 & 0x60) == 0) {
      if ((this->super_AssertData).m_threw_as != true) {
        (this->super_AssertData).m_failed = true;
        goto LAB_0010924e;
      }
LAB_00109223:
      String::String(&local_48,(this->super_AssertData).m_exception_string);
      bVar4 = operator!=(&(this->super_AssertData).m_exception,&local_48);
      (this->super_AssertData).m_failed = bVar4;
      String::~String(&local_48);
      __x = extraout_XMM0_Qa;
      goto LAB_0010924e;
    }
    if ((EVar1 & is_throws_as) != 0) {
      bVar3 = (this->super_AssertData).m_threw_as;
      goto LAB_00109207;
    }
    if ((EVar1 & is_throws_with) != 0) goto LAB_00109223;
    if (-1 < (char)EVar1) goto LAB_0010924e;
    bVar3 = (this->super_AssertData).m_threw;
  }
  else {
    bVar3 = (this->super_AssertData).m_threw;
LAB_00109207:
    bVar3 = bVar3 ^ 1;
  }
  (this->super_AssertData).m_failed = (bool)bVar3;
LAB_0010924e:
  bVar3 = (this->super_AssertData).m_exception.field_0.buf[0x17];
  if ((char)bVar3 < '\0') {
    uVar5 = (this->super_AssertData).m_exception.field_0.data.size;
  }
  else {
    uVar5 = 0x17 - (bVar3 & 0x1f);
  }
  if (uVar5 != 0) {
    rhs = &(this->super_AssertData).m_exception;
    String::String(&local_30,"\"");
    operator+(&local_60,&local_30,rhs);
    String::String(&SStack_78,"\"");
    operator+(&local_48,&local_60,&SStack_78);
    String::operator=(rhs,&local_48);
    String::~String(&local_48);
    String::~String(&SStack_78);
    String::~String(&local_60);
    String::~String(&local_30);
    __x = extraout_XMM0_Qa_00;
  }
  if (is_running_in_test == '\x01') {
    anon_unknown_14::addAssert((this->super_AssertData).m_at);
    puVar2 = *(undefined8 **)(g_cs + 0x10d8);
    __x = extraout_XMM0_Qa_01;
    for (puVar6 = *(undefined8 **)(g_cs + 0x10d0); puVar6 != puVar2; puVar6 = puVar6 + 1) {
      __x = (double)(**(code **)(*(long *)*puVar6 + 0x48))((long *)*puVar6,this);
    }
    if ((this->super_AssertData).m_failed != false) {
      anon_unknown_14::addFailedAssert((this->super_AssertData).m_at);
      __x = extraout_XMM0_Qa_03;
    }
  }
  else if ((this->super_AssertData).m_failed == true) {
    failed_out_of_a_testing_context(&this->super_AssertData);
    __x = extraout_XMM0_Qa_02;
  }
  if ((this->super_AssertData).m_failed == true) {
    isDebuggerActive();
    __x = extraout_XMM0_Qa_04;
  }
  return __x;
}

Assistant:

bool ResultBuilder::log() {
        if(m_at & assertType::is_throws) { //!OCLINT bitwise operator in conditional
            m_failed = !m_threw;
        } else if((m_at & assertType::is_throws_as) && (m_at & assertType::is_throws_with)) { //!OCLINT
            m_failed = !m_threw_as || (m_exception != m_exception_string);
        } else if(m_at & assertType::is_throws_as) { //!OCLINT bitwise operator in conditional
            m_failed = !m_threw_as;
        } else if(m_at & assertType::is_throws_with) { //!OCLINT bitwise operator in conditional
            m_failed = m_exception != m_exception_string;
        } else if(m_at & assertType::is_nothrow) { //!OCLINT bitwise operator in conditional
            m_failed = m_threw;
        }

        if(m_exception.size())
            m_exception = "\"" + m_exception + "\"";

        if(is_running_in_test) {
            addAssert(m_at);
            DOCTEST_ITERATE_THROUGH_REPORTERS(log_assert, *this);

            if(m_failed)
                addFailedAssert(m_at);
        } else if(m_failed) {
            failed_out_of_a_testing_context(*this);
        }

        return m_failed && isDebuggerActive() && !getContextOptions()->no_breaks &&
            (g_cs->currentTest == nullptr || !g_cs->currentTest->m_no_breaks); // break into debugger
    }